

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Vector<unsigned_int,_3> __thiscall
gl4cts::Math::convertBvecToUvec<3>(Math *this,Vector<bool,_3> *src)

{
  bool *pbVar1;
  uint *puVar2;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint uVar3;
  Vector<unsigned_int,_3> VVar4;
  undefined4 local_1c;
  GLint i;
  Vector<bool,_3> *src_local;
  Vector<unsigned_int,_3> *result;
  
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this);
  uVar3 = extraout_EDX;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    pbVar1 = tcu::Vector<bool,_3>::operator[](src,local_1c);
    if ((*pbVar1 & 1U) == 0) {
      puVar2 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)this,local_1c);
      *puVar2 = 0;
      uVar3 = extraout_EDX_01;
    }
    else {
      puVar2 = tcu::Vector<unsigned_int,_3>::operator[]((Vector<unsigned_int,_3> *)this,local_1c);
      *puVar2 = 1;
      uVar3 = extraout_EDX_00;
    }
  }
  VVar4.m_data[2] = uVar3;
  VVar4.m_data._0_8_ = this;
  return (Vector<unsigned_int,_3>)VVar4.m_data;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> convertBvecToUvec(const tcu::Vector<bool, Size>& src)
{
	tcu::Vector<glw::GLuint, Size> result;

	for (glw::GLint i = 0; i < Size; ++i)
	{
		if (GL_FALSE != src[i])
		{
			result[i] = 1;
		}
		else
		{
			result[i] = 0;
		}
	}

	return result;
}